

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void leveldb::AddBoundaryInputs
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *level_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *compaction_files)

{
  bool bVar1;
  FileMetaData *pFVar2;
  FileMetaData *smallest_boundary_file;
  bool continue_searching;
  InternalKey largest_key;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  InternalKey *in_stack_ffffffffffffffc8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffd0;
  InternalKeyComparator *in_stack_ffffffffffffffd8;
  
  InternalKey::InternalKey((InternalKey *)0x12d2ed);
  bVar1 = FindLargestKey(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8);
  if (bVar1) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    while ((uVar3 & 0x1000000) != 0) {
      pFVar2 = FindSmallestBoundaryFile
                         ((InternalKeyComparator *)largest_key.rep_.field_2._M_allocated_capacity,
                          (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)largest_key.rep_._M_string_length,(InternalKey *)largest_key.rep_._0_8_
                         );
      if (pFVar2 == (FileMetaData *)0x0) {
        uVar3 = uVar3 & 0xffffff;
      }
      else {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  (in_stack_ffffffffffffffd0,(value_type *)in_stack_ffffffffffffffc8);
        InternalKey::operator=
                  ((InternalKey *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),(InternalKey *)pFVar2);
      }
    }
  }
  InternalKey::~InternalKey((InternalKey *)0x12d374);
  return;
}

Assistant:

void AddBoundaryInputs(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>& level_files,
                       std::vector<FileMetaData*>* compaction_files) {
  InternalKey largest_key;

  // Quick return if compaction_files is empty.
  if (!FindLargestKey(icmp, *compaction_files, &largest_key)) {
    return;
  }

  bool continue_searching = true;
  while (continue_searching) {
    FileMetaData* smallest_boundary_file =
        FindSmallestBoundaryFile(icmp, level_files, largest_key);

    // If a boundary file was found advance largest_key, otherwise we're done.
    if (smallest_boundary_file != NULL) {
      compaction_files->push_back(smallest_boundary_file);
      largest_key = smallest_boundary_file->largest;
    } else {
      continue_searching = false;
    }
  }
}